

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-sharedata.c
# Opt level: O3

int pconv(lua_State *L)

{
  int iVar1;
  size_t in_RAX;
  void *p;
  lua_State *L_00;
  char *s;
  size_t sz;
  size_t local_28;
  
  local_28 = in_RAX;
  p = lua_touserdata(L,1);
  L_00 = (lua_State *)lua_touserdata(L,2);
  lua_settop(L,0);
  lua_createtable(L,0,0);
  lua_pushcclosure(L_00,convtable,0);
  lua_pushvalue(L_00,1);
  lua_pushlightuserdata(L_00,p);
  iVar1 = lua_pcallk(L_00,2,0,0,0,(lua_KFunction)0x0);
  if (iVar1 != 0) {
    local_28 = 0;
    s = lua_tolstring(L_00,-1,&local_28);
    lua_pushlstring(L,s,local_28);
    lua_error(L);
  }
  luaL_checkstack(L,*(int *)((long)p + 0x10) + 3,(char *)0x0);
  lua_settop(L,1);
  return 1;
}

Assistant:

static int
pconv(lua_State *L) {
	struct context *ctx = lua_touserdata(L,1);
	lua_State * pL = lua_touserdata(L, 2);
	int ret;

	lua_settop(L, 0);

	// init L (may throw memory error)
	// create a table for string map
	lua_newtable(L);

	lua_pushcfunction(pL, convtable);
	lua_pushvalue(pL,1);
	lua_pushlightuserdata(pL, ctx);

	ret = lua_pcall(pL, 2, 0, 0);
	if (ret != LUA_OK) {
		size_t sz = 0;
		const char * error = lua_tolstring(pL, -1, &sz);
		lua_pushlstring(L, error, sz);
		lua_error(L);
		// never get here
	}

	luaL_checkstack(L, ctx->string_index + 3, NULL);
	lua_settop(L,1);

	return 1;
}